

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxcox.c
# Opt level: O0

double boxcox_loglik(double lambda,void *params)

{
  int N_00;
  double *vec;
  double dVar1;
  double dVar2;
  double *xpar;
  double *tdata;
  int i;
  int N;
  double sum;
  double variance;
  double loglik;
  void *params_local;
  double lambda_local;
  
  N_00 = (int)*params;
  vec = (double *)malloc((long)N_00 << 3);
  _i = 0.0;
  for (tdata._0_4_ = 0; (int)tdata < N_00; tdata._0_4_ = (int)tdata + 1) {
    dVar1 = log(*(double *)((long)params + (long)((int)tdata + 1) * 8));
    vec[(int)tdata] = dVar1;
    _i = vec[(int)tdata] + _i;
  }
  if ((lambda != 0.0) || (NAN(lambda))) {
    for (tdata._0_4_ = 0; (int)tdata < N_00; tdata._0_4_ = (int)tdata + 1) {
      dVar1 = pow(*(double *)((long)params + (long)((int)tdata + 1) * 8),lambda);
      vec[(int)tdata] = dVar1 / lambda;
    }
    sum = var(vec,N_00);
  }
  else {
    sum = var(vec,N_00);
  }
  dVar1 = *params;
  dVar2 = log(sum);
  free(vec);
  return -((lambda - 1.0) * _i + -((dVar1 / 2.0) * dVar2));
}

Assistant:

double boxcox_loglik(double lambda, void *params) {
    double loglik,variance,sum;
    int N,i;
    double *tdata;
    double *xpar = (double*) params;

    N = (int) xpar[0];
    tdata = (double*) malloc(sizeof(double) *N);

    sum = 0.0;
    for(i = 0; i < N;++i) {
        tdata[i] = log(xpar[i+1]);
        sum += tdata[i];
    }

    if (lambda == 0) {
        variance = var(tdata,N);
    } else {
        for(i = 0; i < N;++i) {
            tdata[i] = pow(xpar[i+1],lambda) / lambda;
        }
        variance = var(tdata,N);
    }

    loglik = (lambda-1)*sum - (xpar[0]/2.0)*log(variance);

    free(tdata);
    return -loglik;
}